

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O3

void sort_5_3::test(void)

{
  ps_int((int *)&DAT_001051c0,10);
  merge_sort_4((int *)&DAT_001051c0,0,9);
}

Assistant:

void test() {
        int a1[] = {12, 4, 67, 5, 88, 15, 34, 26, 33, 19};
        ps_int(a1, 10);
//        select_sort_1(a1, 10);
//        bubble_sort_1(a1, 10);
//        insert_sort_1(a1, 10);
//        insert_sort_b_1(a1, 10);
//        shell_sort_1(a1, 10);
//        quick_sort_2(a1, 0, 9);
//        heap_sort_4(a1, 10);
        merge_sort_4(a1, 0, 9);
        ps_int(a1, 10);
    }